

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

GLuint QOpenGLTexture::boundTextureId(BindingTarget target)

{
  GLuint GVar1;
  long lVar2;
  long *plVar3;
  long in_FS_OFFSET;
  GLint textureId;
  GLuint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = QOpenGLContext::currentContext();
  if (lVar2 == 0) {
    boundTextureId();
    GVar1 = 0;
  }
  else {
    local_1c = 0;
    plVar3 = (long *)QOpenGLContext::functions();
    (**(code **)(*plVar3 + 200))(target,&local_1c);
    GVar1 = local_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return GVar1;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGLTexture::boundTextureId(BindingTarget target)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::boundTextureId() requires a valid current context");
        return 0;
    }

    GLint textureId = 0;
    ctx->functions()->glGetIntegerv(target, &textureId);
    return static_cast<GLuint>(textureId);
}